

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_sub_complex.h
# Opt level: O1

optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::get_address(optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *__return_storage_ptr__,
             Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
             *this,Root_vertex_handle global)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle> *res;
  _Base_ptr p_Var3;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  p_Var2 = &(this->addresses)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var2->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < global.vertex]) {
    if (global.vertex <= (int)p_Var3[1]._M_color) {
      p_Var1 = p_Var3;
    }
  }
  p_Var3 = &p_Var2->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var2) &&
     (p_Var3 = p_Var1, global.vertex < (int)p_Var1[1]._M_color)) {
    p_Var3 = &p_Var2->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var2) {
    (__return_storage_ptr__->super_type).m_storage.dummy_ = *(dummy_u *)&p_Var3[1].field_0x4;
    (__return_storage_ptr__->super_type).m_initialized = true;
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Vertex_handle> get_address(Root_vertex_handle global) const {
    boost::optional < Vertex_handle > res;
    IdAddressMapConstIterator it = addresses.find(global);
    if (it == addresses.end())
      res.reset();
    else
      res = (*it).second;
    return res;
  }